

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resize.c
# Opt level: O2

void highbd_interpolate(uint16_t *input,int in_length,uint16_t *output,int out_length,int bd)

{
  uint16_t uVar1;
  int iVar2;
  InterpKernel *paiVar3;
  uint uVar4;
  long lVar5;
  uint uVar6;
  long lVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  int iVar11;
  int iVar12;
  
  iVar2 = out_length / 2;
  iVar11 = 0;
  uVar8 = (uint)(in_length * 0x4000 + iVar2) / (uint)out_length;
  iVar12 = -iVar2;
  if (in_length - out_length != 0 && out_length <= in_length) {
    iVar12 = iVar2;
  }
  iVar12 = ((in_length - out_length) * 0x2000 + iVar12) / out_length;
  uVar6 = iVar12 + 0x80;
  for (uVar4 = uVar6; (int)uVar4 < 0xc000; uVar4 = uVar4 + uVar8) {
    iVar11 = iVar11 + 1;
  }
  iVar2 = iVar12 + (out_length + -1) * uVar8 + 0x80;
  iVar12 = out_length;
  for (; in_length <= (iVar2 >> 0xe) + 4; iVar2 = iVar2 - uVar8) {
    iVar12 = iVar12 + -1;
  }
  paiVar3 = choose_interp_filter(in_length,out_length);
  if (iVar12 + -1 < iVar11) {
    iVar12 = 0;
    if (out_length < 1) {
      out_length = iVar12;
    }
    for (; iVar12 != out_length; iVar12 = iVar12 + 1) {
      iVar2 = 0;
      for (lVar7 = 0; lVar7 != 8; lVar7 = lVar7 + 1) {
        uVar4 = ((int)uVar6 >> 0xe) + -3 + (int)lVar7;
        if ((int)(in_length - 1U) <= (int)uVar4) {
          uVar4 = in_length - 1U;
        }
        uVar10 = (ulong)uVar4;
        if ((int)uVar4 < 1) {
          uVar10 = 0;
        }
        iVar2 = iVar2 + (uint)input[uVar10] *
                        (int)*(short *)((long)*paiVar3 + lVar7 * 2 + (ulong)(uVar6 >> 4 & 0x3f0));
      }
      uVar1 = clip_pixel_highbd(iVar2 + 0x40 >> 7,bd);
      *output = uVar1;
      output = output + 1;
      uVar6 = uVar6 + uVar8;
    }
  }
  else {
    for (iVar2 = 0; iVar11 != iVar2; iVar2 = iVar2 + 1) {
      iVar9 = 0;
      for (lVar7 = 0; lVar7 != 8; lVar7 = lVar7 + 1) {
        uVar4 = ((int)uVar6 >> 0xe) + -3 + (int)lVar7;
        if ((int)uVar4 < 1) {
          uVar4 = 0;
        }
        iVar9 = iVar9 + (uint)input[uVar4] *
                        (int)*(short *)((long)*paiVar3 + lVar7 * 2 + (ulong)(uVar6 >> 4 & 0x3f0));
      }
      uVar1 = clip_pixel_highbd(iVar9 + 0x40 >> 7,bd);
      *output = uVar1;
      output = output + 1;
      uVar6 = uVar6 + uVar8;
    }
    for (; iVar11 <= iVar12 + -1; iVar11 = iVar11 + 1) {
      lVar5 = 0;
      iVar2 = 0;
      for (lVar7 = -3; lVar7 != 5; lVar7 = lVar7 + 1) {
        iVar2 = iVar2 + (uint)input[((int)uVar6 >> 0xe) + lVar7] *
                        (int)*(short *)((long)*paiVar3 + lVar5 * 2 + (ulong)(uVar6 >> 4 & 0x3f0));
        lVar5 = lVar5 + 1;
      }
      uVar1 = clip_pixel_highbd(iVar2 + 0x40 >> 7,bd);
      *output = uVar1;
      output = output + 1;
      uVar6 = uVar6 + uVar8;
    }
    for (; iVar12 < out_length; iVar12 = iVar12 + 1) {
      iVar2 = 0;
      for (lVar7 = 0; lVar7 != 8; lVar7 = lVar7 + 1) {
        iVar11 = ((int)uVar6 >> 0xe) + -3 + (int)lVar7;
        if (in_length + -1 <= iVar11) {
          iVar11 = in_length + -1;
        }
        iVar2 = iVar2 + (uint)input[iVar11] *
                        (int)*(short *)((long)*paiVar3 + lVar7 * 2 + (ulong)(uVar6 >> 4 & 0x3f0));
      }
      uVar1 = clip_pixel_highbd(iVar2 + 0x40 >> 7,bd);
      *output = uVar1;
      output = output + 1;
      uVar6 = uVar6 + uVar8;
    }
  }
  return;
}

Assistant:

static void highbd_interpolate(const uint16_t *const input, int in_length,
                               uint16_t *output, int out_length, int bd) {
  const InterpKernel *interp_filters =
      choose_interp_filter(in_length, out_length);

  highbd_interpolate_core(input, in_length, output, out_length, bd,
                          &interp_filters[0][0], SUBPEL_TAPS);
}